

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::GenerateDeclaration
          (ExtensionGenerator *this,Printer *printer)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  string qualifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Formatter format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  bVar3 = IsScoped(this);
  if (bVar3) {
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x3e5eae);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x3e5e33);
    sVar1 = (this->options_).dllexport_decl._M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (this->options_).dllexport_decl._M_dataplus._M_p;
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>((string *)local_a8,pcVar2,pcVar2 + sVar1);
      std::__cxx11::string::append((char *)local_a8);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_a8,(ulong)local_c8._M_dataplus._M_p);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_78 = *plVar5;
        lStack_70 = plVar4[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar5;
        local_88 = (long *)*plVar4;
      }
      local_80 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
      if (local_88 != &local_78) {
        operator_delete(local_88);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
    }
  }
  Formatter::operator()
            (&local_68,
             "static const int $constant_name$ = $number$;\n$1$ ::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n  ${2$$name$$}$;\n"
             ,&local_c8,&this->descriptor_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void ExtensionGenerator::GenerateDeclaration(io::Printer* printer) const {
  Formatter format(printer, variables_);

  // If this is a class member, it needs to be declared "static".  Otherwise,
  // it needs to be "extern".  In the latter case, it also needs the DLL
  // export/import specifier.
  std::string qualifier;
  if (!IsScoped()) {
    qualifier = "extern";
    if (!options_.dllexport_decl.empty()) {
      qualifier = options_.dllexport_decl + " " + qualifier;
    }
  } else {
    qualifier = "static";
  }

  format(
      "static const int $constant_name$ = $number$;\n"
      "$1$ ::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n"
      "    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n"
      "  ${2$$name$$}$;\n",
      qualifier, descriptor_);
}